

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float fVar1;
  char **ppcVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  FILE *__s;
  runtime_error *this;
  int i;
  Gamut gamut;
  float *pfVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int res;
  int local_8c;
  char **local_88;
  int local_7c;
  float *out;
  float *scale;
  ulong local_68;
  int nThreads;
  function<void_(long)> local_58;
  
  if (argc < 3) {
    pcVar8 = 
    "Syntax: rgb2spec_opt <resolution> <output> [<gamut>]\nwhere <gamut> is one of sRGB,eRGB,XYZ,ProPhotoRGB,ACES2065_1,REC2020"
    ;
  }
  else {
    gamut = SRGB;
    if (argc != 3) {
      pcVar8 = argv[3];
      iVar3 = strcasecmp(pcVar8,"sRGB");
      if (iVar3 != 0) {
        iVar3 = strcasecmp(pcVar8,"eRGB");
        if (iVar3 == 0) {
          gamut = ERGB;
        }
        else {
          iVar3 = strcasecmp(pcVar8,"XYZ");
          if (iVar3 == 0) {
            gamut = XYZ;
          }
          else {
            iVar3 = strcasecmp(pcVar8,"ProPhotoRGB");
            if (iVar3 == 0) {
              gamut = ProPhotoRGB;
            }
            else {
              iVar3 = strcasecmp(pcVar8,"ACES2065_1");
              if (iVar3 == 0) {
                gamut = ACES2065_1;
              }
              else {
                iVar3 = strcasecmp(pcVar8,"REC2020");
                if (iVar3 == 0) {
                  gamut = REC2020;
                }
                else {
                  iVar3 = strcasecmp(pcVar8,"DCI_P3");
                  if (iVar3 != 0) {
                    fprintf(_stderr,"Could not parse gamut `%s\'!\n",pcVar8);
                    goto LAB_001058bc;
                  }
                  gamut = DCI_P3;
                }
              }
            }
          }
        }
      }
    }
    init_tables(gamut);
    uVar4 = atoi(argv[1]);
    if (uVar4 != 0) {
      res = uVar4;
      nThreads = AvailableCores();
      std::make_unique<ThreadPool,int&>((int *)&scale);
      pfVar6 = scale;
      scale = (float *)0x0;
      std::__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>::reset
                ((__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_> *)&threadPool,
                 (pointer)pfVar6);
      std::unique_ptr<ThreadPool,_std::default_delete<ThreadPool>_>::~unique_ptr
                ((unique_ptr<ThreadPool,_std::default_delete<ThreadPool>_> *)&scale);
      uVar9 = 0;
      local_88 = argv;
      printf("Optimizing %s spectra...\n",argv[3]);
      fflush(_stdout);
      uVar7 = (long)(int)uVar4 << 2;
      if ((int)uVar4 < 0) {
        uVar7 = 0xffffffffffffffff;
      }
      uVar11 = 0;
      if (0 < (int)uVar4) {
        uVar11 = (ulong)uVar4;
      }
      scale = (float *)operator_new__(uVar7);
      for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        fVar1 = (float)(int)uVar9 / (float)(int)(uVar4 - 1);
        fVar1 = fVar1 * fVar1 * (3.0 - (fVar1 + fVar1));
        scale[uVar9] = fVar1 * fVar1 * (3.0 - (fVar1 + fVar1));
      }
      iVar3 = uVar4 * uVar4 * uVar4 * 9;
      uVar7 = (long)iVar3 * 4;
      if (iVar3 < 0) {
        uVar7 = 0xffffffffffffffff;
      }
      out = (float *)operator_new__(uVar7);
      for (local_8c = 0; ppcVar2 = local_88, local_8c < 3; local_8c = local_8c + 1) {
        lVar10 = (long)res;
        local_58 = (function<void_(long)>)ZEXT1632(ZEXT816(0) << 0x40);
        plVar5 = (long *)operator_new(0x20);
        *plVar5 = (long)&res;
        local_58.super__Function_base._M_functor._M_unused._M_object = plVar5;
        local_58.super__Function_base._M_manager =
             std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/pbrt/cmd/rgb2spec_opt.cpp:826:29)>
             ::_M_manager;
        local_58._M_invoker =
             std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/pbrt/cmd/rgb2spec_opt.cpp:826:29)>
             ::_M_invoke;
        plVar5[1] = (long)&scale;
        plVar5[2] = (long)&local_8c;
        plVar5[3] = (long)&out;
        ParallelFor(0,lVar10,&local_58,(char *)0x0);
        std::_Function_base::~_Function_base(&local_58.super__Function_base);
      }
      __s = fopen(local_88[2],"w");
      if (__s == (FILE *)0x0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Could not create file!");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      fwrite("namespace pbrt {\n",0x11,1,__s);
      fprintf(__s,"extern const int %sToSpectrumTable_Res = %d;\n",ppcVar2[3],(ulong)(uint)res);
      fprintf(__s,"extern const float %sToSpectrumTable_Scale[%d] = {\n",ppcVar2[3],(ulong)(uint)res
             );
      for (lVar10 = 0; lVar10 < res; lVar10 = lVar10 + 1) {
        fprintf(__s,"%.9g, ",(double)scale[lVar10]);
      }
      fwrite("};\n",3,1,__s);
      fprintf(__s,"extern const float %sToSpectrumTable_Data[3][%d][%d][%d][3] = {\n",ppcVar2[3],
              (ulong)(uint)res,(ulong)(uint)res,(ulong)(uint)res);
      uVar4 = 0;
      pfVar6 = out;
      while (uVar4 != 3) {
        local_68 = (ulong)uVar4;
        fwrite("{ ",2,1,__s);
        iVar3 = 0;
        while (iVar3 < res) {
          local_7c = iVar3;
          fwrite("{ ",2,1,__s);
          iVar3 = 0;
          while (iVar3 < res) {
            local_88 = (char **)CONCAT44(local_88._4_4_,iVar3);
            fwrite("{ ",2,1,__s);
            for (iVar3 = 0; iVar3 < res; iVar3 = iVar3 + 1) {
              fwrite("{ ",2,1,__s);
              for (lVar10 = 0; (int)lVar10 != 0xc; lVar10 = lVar10 + 4) {
                fprintf(__s,"%.9g, ",(double)*(float *)((long)pfVar6 + lVar10));
              }
              fwrite("}, ",3,1,__s);
              pfVar6 = (float *)((long)pfVar6 + lVar10);
            }
            fwrite("},\n    ",7,1,__s);
            iVar3 = (int)local_88 + 1;
          }
          fwrite("}, ",3,1,__s);
          iVar3 = local_7c + 1;
        }
        fwrite("}, ",3,1,__s);
        uVar4 = (int)local_68 + 1;
      }
      fwrite("};\n",3,1,__s);
      fwrite("} // namespace pbrt\n",0x14,1,__s);
      fclose(__s);
      std::__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>::reset
                ((__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_> *)&threadPool,
                 (pointer)0x0);
      return 0;
    }
    pcVar8 = "Invalid resolution!";
    res = 0;
  }
  puts(pcVar8);
LAB_001058bc:
  exit(-1);
}

Assistant:

int main(int argc, char **argv) {
    if (argc < 3) {
        printf("Syntax: rgb2spec_opt <resolution> <output> [<gamut>]\n"
               "where <gamut> is one of "
               "sRGB,eRGB,XYZ,ProPhotoRGB,ACES2065_1,REC2020\n");
        exit(-1);
    }
    Gamut gamut = SRGB;
    if (argc > 3)
        gamut = parse_gamut(argv[3]);
    if (gamut == NO_GAMUT) {
        fprintf(stderr, "Could not parse gamut `%s'!\n", argv[3]);
        exit(-1);
    }
    init_tables(gamut);

    const int res = atoi(argv[1]);
    if (res == 0) {
        printf("Invalid resolution!\n");
        exit(-1);
    }

    int nThreads = AvailableCores();
    threadPool = std::make_unique<ThreadPool>(nThreads);

    printf("Optimizing %s spectra...\n", argv[3]);
    fflush(stdout);

    float *scale = new float[res];
    for (int k = 0; k < res; ++k)
        scale[k] = (float)smoothstep(smoothstep(k / double(res - 1)));

    size_t bufsize = 3 * 3 * res * res * res;
    float *out = new float[bufsize];

    for (int l = 0; l < 3; ++l) {
        ParallelFor(0, res, [&](size_t j) {
            const double y = j / double(res - 1);
            fflush(stdout);
            for (int i = 0; i < res; ++i) {
                const double x = i / double(res - 1);
                double coeffs[3], rgb[3];
                memset(coeffs, 0, sizeof(double) * 3);

                int start = res / 5;

                for (int k = start; k < res; ++k) {
                    double b = (double)scale[k];

                    rgb[l] = b;
                    rgb[(l + 1) % 3] = x * b;
                    rgb[(l + 2) % 3] = y * b;

                    gauss_newton(rgb, coeffs);

                    double c0 = 360.0, c1 = 1.0 / (830.0 - 360.0);
                    double A = coeffs[0], B = coeffs[1], C = coeffs[2];

                    int idx = ((l * res + k) * res + j) * res + i;

                    out[3 * idx + 0] = float(A * (sqr(c1)));
                    out[3 * idx + 1] = float(B * c1 - 2 * A * c0 * (sqr(c1)));
                    out[3 * idx + 2] = float(C - B * c0 * c1 + A * (sqr(c0 * c1)));
                    // out[3*idx + 2] = resid;
                }

                memset(coeffs, 0, sizeof(double) * 3);
                for (int k = start; k >= 0; --k) {
                    double b = (double)scale[k];

                    rgb[l] = b;
                    rgb[(l + 1) % 3] = x * b;
                    rgb[(l + 2) % 3] = y * b;

                    gauss_newton(rgb, coeffs);

                    double c0 = 360.0, c1 = 1.0 / (830.0 - 360.0);
                    double A = coeffs[0], B = coeffs[1], C = coeffs[2];

                    int idx = ((l * res + k) * res + j) * res + i;

                    out[3 * idx + 0] = float(A * (sqr(c1)));
                    out[3 * idx + 1] = float(B * c1 - 2 * A * c0 * (sqr(c1)));
                    out[3 * idx + 2] = float(C - B * c0 * c1 + A * (sqr(c0 * c1)));
                    // out[3*idx + 2] = resid;
                }
            }
        });
    }

    FILE *f = fopen(argv[2], "w");
    if (f == nullptr)
        throw std::runtime_error("Could not create file!");
    fprintf(f, "namespace pbrt {\n");
    fprintf(f, "extern const int %sToSpectrumTable_Res = %d;\n", argv[3], res);
    fprintf(f, "extern const float %sToSpectrumTable_Scale[%d] = {\n", argv[3], res);
    for (int i = 0; i < res; ++i)
        fprintf(f, "%.9g, ", scale[i]);
    fprintf(f, "};\n");
    fprintf(f, "extern const float %sToSpectrumTable_Data[3][%d][%d][%d][3] = {\n",
            argv[3], res, res, res);
    const float *ptr = out;
    for (int maxc = 0; maxc < 3; ++maxc) {
        fprintf(f, "{ ");
        for (int z = 0; z < res; ++z) {
            fprintf(f, "{ ");
            for (int y = 0; y < res; ++y) {
                fprintf(f, "{ ");
                for (int x = 0; x < res; ++x) {
                    fprintf(f, "{ ");
                    for (int c = 0; c < 3; ++c)
                        fprintf(f, "%.9g, ", *ptr++);
                    fprintf(f, "}, ");
                }
                fprintf(f, "},\n    ");
            }
            fprintf(f, "}, ");
        }
        fprintf(f, "}, ");
    }
    fprintf(f, "};\n");
    fprintf(f, "} // namespace pbrt\n");
    fclose(f);

    threadPool.reset();
}